

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

void Nwk_ManMarkFanins_rec(Nwk_Obj_t *pLut,int nLevMin)

{
  int iVar1;
  long lVar2;
  
  if (((((*(uint *)&pLut->field_0x20 & 7) == 3) &&
       (iVar1 = pLut->pMan->nTravIds, pLut->TravId != iVar1)) &&
      (pLut->TravId = iVar1, nLevMin <= pLut->Level)) && (0 < pLut->nFanins)) {
    lVar2 = 0;
    do {
      if (pLut->pFanio[lVar2] == (Nwk_Obj_t *)0x0) {
        return;
      }
      Nwk_ManMarkFanins_rec(pLut->pFanio[lVar2],nLevMin);
      lVar2 = lVar2 + 1;
    } while (lVar2 < pLut->nFanins);
  }
  return;
}

Assistant:

void Nwk_ManMarkFanins_rec( Nwk_Obj_t * pLut, int nLevMin )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( !Nwk_ObjIsNode(pLut) )
        return;
    if ( Nwk_ObjIsTravIdCurrent( pLut ) )
        return;
    Nwk_ObjSetTravIdCurrent( pLut );
    if ( Nwk_ObjLevel(pLut) < nLevMin )
        return;
    Nwk_ObjForEachFanin( pLut, pNext, i )
        Nwk_ManMarkFanins_rec( pNext, nLevMin );
}